

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::dtime_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (dtime_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  undefined8 uVar6;
  ulong uVar7;
  idx_t iVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Vector *result_2;
  unsigned_long uVar13;
  string_t sVar14;
  Vector *result;
  char **local_80;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_80 = &(result_data->value).pointer.ptr;
      iVar8 = 0;
      do {
        sVar14 = StringCast::Operation<duckdb::dtime_t>
                           ((dtime_t)ldata[iVar8].micros,(Vector *)dataptr);
        uVar6 = sVar14.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_80 + -1);
        paVar1->length = (int)uVar6;
        paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
        *local_80 = sVar14.value._8_8_;
        iVar8 = iVar8 + 1;
        local_80 = local_80 + 2;
      } while (count != iVar8);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_40;
      peVar3 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      uVar7 = 0;
      uVar12 = 0;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = puVar2[uVar7];
        }
        uVar11 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar11 = count;
        }
        uVar10 = uVar11;
        if (uVar13 != 0) {
          uVar10 = uVar12;
          if (uVar13 == 0xffffffffffffffff) {
            if (uVar12 < uVar11) {
              ppcVar9 = &result_data[uVar12].value.pointer.ptr;
              do {
                sVar14 = StringCast::Operation<duckdb::dtime_t>
                                   ((dtime_t)ldata[uVar12].micros,(Vector *)dataptr);
                uVar6 = sVar14.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
                paVar1->length = (int)uVar6;
                paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
                *ppcVar9 = sVar14.value._8_8_;
                uVar12 = uVar12 + 1;
                ppcVar9 = ppcVar9 + 2;
                uVar10 = uVar12;
              } while (uVar11 != uVar12);
            }
          }
          else if (uVar12 < uVar11) {
            ppcVar9 = &result_data[uVar12].value.pointer.ptr;
            uVar10 = 0;
            do {
              if ((uVar13 >> (uVar10 & 0x3f) & 1) != 0) {
                sVar14 = StringCast::Operation<duckdb::dtime_t>
                                   ((dtime_t)ldata[uVar12 + uVar10].micros,(Vector *)dataptr);
                uVar6 = sVar14.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
                paVar1->length = (int)uVar6;
                paVar1->prefix[0] = (char)((ulong)uVar6 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar6 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar6 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar6 >> 0x38);
                *ppcVar9 = sVar14.value._8_8_;
              }
              uVar10 = uVar10 + 1;
              ppcVar9 = ppcVar9 + 2;
            } while ((uVar12 - uVar11) + uVar10 != 0);
            uVar10 = uVar12 + uVar10;
          }
        }
        uVar7 = uVar7 + 1;
        uVar12 = uVar10;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}